

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

String fromCString(char *buf)

{
  size_t __size;
  String psVar1;
  char *pcVar2;
  String s;
  size_t len;
  char *buf_local;
  
  __size = strlen(buf);
  psVar1 = (String)malloc(0x18);
  pcVar2 = (char *)malloc(__size);
  psVar1->data = pcVar2;
  psVar1->capacity = __size;
  psVar1->length = __size;
  memcpy(psVar1->data,buf,__size);
  return psVar1;
}

Assistant:

String fromCString(const char *buf) {
    size_t len = strlen(buf);
    String s = malloc(sizeof(struct string));
    s->data = malloc(sizeof(char) * len);
    s->capacity = len;
    s->length = len;
    memcpy(s->data, buf, sizeof(char) * len);
    return s;
}